

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix<Complex> __thiscall Matrix<Complex>::transposed(Matrix<Complex> *this)

{
  Complex *extraout_RDX;
  Complex *pCVar1;
  Complex *extraout_RDX_00;
  uint j;
  ulong uVar2;
  uint *in_RSI;
  long lVar3;
  uint i;
  ulong uVar4;
  Matrix<Complex> MVar5;
  
  Matrix(this,in_RSI[1],*in_RSI);
  pCVar1 = extraout_RDX;
  for (uVar4 = 0; uVar4 < *in_RSI; uVar4 = uVar4 + 1) {
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < in_RSI[1]; uVar2 = uVar2 + 1) {
      Complex::operator=(this->arr + this->N * (int)uVar2 + uVar4,
                         (Complex *)
                         ((ulong)(in_RSI[1] * (int)uVar4) * 0x80 + *(long *)(in_RSI + 2) + lVar3));
      lVar3 = lVar3 + 0x80;
      pCVar1 = extraout_RDX_00;
    }
  }
  MVar5.arr = pCVar1;
  MVar5._0_8_ = this;
  return MVar5;
}

Assistant:

const Matrix<Field> Matrix<Field>::transposed() const
{
    Matrix res(N, M);
    for(unsigned i = 0; i < M; ++i)
        for(unsigned j = 0; j < N; ++j)
        {
            res[j][i] = (*this)[i][j];
        }
    return res;
}